

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

void __thiscall spirv_cross::ParsedIR::ParsedIR(ParsedIR *this)

{
  ObjectPoolGroup *this_00;
  pointer pOVar1;
  ObjectPool<spirv_cross::SPIRType> *this_01;
  ObjectPool<spirv_cross::SPIRVariable> *this_02;
  ObjectPool<spirv_cross::SPIRConstant> *this_03;
  ObjectPool<spirv_cross::SPIRFunction> *this_04;
  ObjectPool<spirv_cross::SPIRFunctionPrototype> *this_05;
  ObjectPool<spirv_cross::SPIRBlock> *this_06;
  ObjectPool<spirv_cross::SPIRExtension> *this_07;
  ObjectPool<spirv_cross::SPIRExpression> *this_08;
  ObjectPool<spirv_cross::SPIRConstantOp> *this_09;
  ObjectPool<spirv_cross::SPIRCombinedImageSampler> *this_10;
  ObjectPool<spirv_cross::SPIRAccessChain> *this_11;
  ObjectPool<spirv_cross::SPIRUndef> *this_12;
  ObjectPool<spirv_cross::SPIRString> *this_13;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *local_28;
  ParsedIR *this_local;
  
  ::std::unique_ptr<spirv_cross::ObjectPoolGroup,std::default_delete<spirv_cross::ObjectPoolGroup>>
  ::unique_ptr<std::default_delete<spirv_cross::ObjectPoolGroup>,void>
            ((unique_ptr<spirv_cross::ObjectPoolGroup,std::default_delete<spirv_cross::ObjectPoolGroup>>
              *)this);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->spirv);
  SmallVector<spirv_cross::Variant,_8UL>::SmallVector(&this->ids);
  ::std::
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  ::unordered_map(&this->meta);
  local_28 = this->ids_for_type;
  do {
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::SmallVector(local_28);
    local_28 = local_28 + 1;
  } while (local_28 != &this->ids_for_constant_undef_or_type);
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::SmallVector
            (&this->ids_for_constant_undef_or_type);
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::SmallVector
            (&this->ids_for_constant_or_variable);
  ::std::
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int>_>_>
  ::unordered_map(&this->load_type_width);
  SmallVector<spv::Capability,_8UL>::SmallVector(&this->declared_capabilities);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::SmallVector(&this->declared_extensions);
  SmallVector<unsigned_char,_8UL>::SmallVector(&this->block_meta);
  ::std::
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>_>
  ::unordered_map(&this->continue_block_to_loop_header);
  ::std::
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>_>
  ::unordered_map(&this->entry_points);
  TypedID<(spirv_cross::Types)4>::TypedID(&this->default_entry_point,0);
  Source::Source(&this->source);
  this->addressing_model = AddressingModelMax;
  this->memory_model = Max;
  this->loop_iteration_depth_hard = 0;
  this->loop_iteration_depth_soft = 0;
  ::std::__cxx11::string::string((string *)&this->empty_string);
  Bitset::Bitset(&this->cleared_bitset);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->meta_needing_name_fixup);
  this_00 = (ObjectPoolGroup *)operator_new(0x70);
  ObjectPoolGroup::ObjectPoolGroup(this_00);
  ::std::
  unique_ptr<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>::
  reset(&this->pool_group,this_00);
  pOVar1 = ::std::
           unique_ptr<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ::operator->(&this->pool_group);
  this_01 = (ObjectPool<spirv_cross::SPIRType> *)operator_new(0x88);
  ObjectPool<spirv_cross::SPIRType>::ObjectPool(this_01,0x10);
  ::std::unique_ptr<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
  ::reset(pOVar1->pools + 1,(pointer)this_01);
  pOVar1 = ::std::
           unique_ptr<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ::operator->(&this->pool_group);
  this_02 = (ObjectPool<spirv_cross::SPIRVariable> *)operator_new(0x88);
  ObjectPool<spirv_cross::SPIRVariable>::ObjectPool(this_02,0x10);
  ::std::unique_ptr<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
  ::reset(pOVar1->pools + 2,(pointer)this_02);
  pOVar1 = ::std::
           unique_ptr<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ::operator->(&this->pool_group);
  this_03 = (ObjectPool<spirv_cross::SPIRConstant> *)operator_new(0x88);
  ObjectPool<spirv_cross::SPIRConstant>::ObjectPool(this_03,0x10);
  ::std::unique_ptr<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
  ::reset(pOVar1->pools + 3,(pointer)this_03);
  pOVar1 = ::std::
           unique_ptr<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ::operator->(&this->pool_group);
  this_04 = (ObjectPool<spirv_cross::SPIRFunction> *)operator_new(0x88);
  ObjectPool<spirv_cross::SPIRFunction>::ObjectPool(this_04,0x10);
  ::std::unique_ptr<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
  ::reset(pOVar1->pools + 4,(pointer)this_04);
  pOVar1 = ::std::
           unique_ptr<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ::operator->(&this->pool_group);
  this_05 = (ObjectPool<spirv_cross::SPIRFunctionPrototype> *)operator_new(0x88);
  ObjectPool<spirv_cross::SPIRFunctionPrototype>::ObjectPool(this_05,0x10);
  ::std::unique_ptr<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
  ::reset(pOVar1->pools + 5,(pointer)this_05);
  pOVar1 = ::std::
           unique_ptr<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ::operator->(&this->pool_group);
  this_06 = (ObjectPool<spirv_cross::SPIRBlock> *)operator_new(0x88);
  ObjectPool<spirv_cross::SPIRBlock>::ObjectPool(this_06,0x10);
  ::std::unique_ptr<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
  ::reset(pOVar1->pools + 6,(pointer)this_06);
  pOVar1 = ::std::
           unique_ptr<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ::operator->(&this->pool_group);
  this_07 = (ObjectPool<spirv_cross::SPIRExtension> *)operator_new(0x88);
  ObjectPool<spirv_cross::SPIRExtension>::ObjectPool(this_07,0x10);
  ::std::unique_ptr<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
  ::reset(pOVar1->pools + 7,(pointer)this_07);
  pOVar1 = ::std::
           unique_ptr<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ::operator->(&this->pool_group);
  this_08 = (ObjectPool<spirv_cross::SPIRExpression> *)operator_new(0x88);
  ObjectPool<spirv_cross::SPIRExpression>::ObjectPool(this_08,0x10);
  ::std::unique_ptr<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
  ::reset(pOVar1->pools + 8,(pointer)this_08);
  pOVar1 = ::std::
           unique_ptr<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ::operator->(&this->pool_group);
  this_09 = (ObjectPool<spirv_cross::SPIRConstantOp> *)operator_new(0x88);
  ObjectPool<spirv_cross::SPIRConstantOp>::ObjectPool(this_09,0x10);
  ::std::unique_ptr<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
  ::reset(pOVar1->pools + 9,(pointer)this_09);
  pOVar1 = ::std::
           unique_ptr<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ::operator->(&this->pool_group);
  this_10 = (ObjectPool<spirv_cross::SPIRCombinedImageSampler> *)operator_new(0x88);
  ObjectPool<spirv_cross::SPIRCombinedImageSampler>::ObjectPool(this_10,0x10);
  ::std::unique_ptr<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
  ::reset(pOVar1->pools + 10,(pointer)this_10);
  pOVar1 = ::std::
           unique_ptr<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ::operator->(&this->pool_group);
  this_11 = (ObjectPool<spirv_cross::SPIRAccessChain> *)operator_new(0x88);
  ObjectPool<spirv_cross::SPIRAccessChain>::ObjectPool(this_11,0x10);
  ::std::unique_ptr<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
  ::reset(pOVar1->pools + 0xb,(pointer)this_11);
  pOVar1 = ::std::
           unique_ptr<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ::operator->(&this->pool_group);
  this_12 = (ObjectPool<spirv_cross::SPIRUndef> *)operator_new(0x88);
  ObjectPool<spirv_cross::SPIRUndef>::ObjectPool(this_12,0x10);
  ::std::unique_ptr<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
  ::reset(pOVar1->pools + 0xc,(pointer)this_12);
  pOVar1 = ::std::
           unique_ptr<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ::operator->(&this->pool_group);
  this_13 = (ObjectPool<spirv_cross::SPIRString> *)operator_new(0x88);
  ObjectPool<spirv_cross::SPIRString>::ObjectPool(this_13,0x10);
  ::std::unique_ptr<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
  ::reset(pOVar1->pools + 0xd,(pointer)this_13);
  return;
}

Assistant:

ParsedIR::ParsedIR()
{
	// If we move ParsedIR, we need to make sure the pointer stays fixed since the child Variant objects consume a pointer to this group,
	// so need an extra pointer here.
	pool_group.reset(new ObjectPoolGroup);

	pool_group->pools[TypeType].reset(new ObjectPool<SPIRType>);
	pool_group->pools[TypeVariable].reset(new ObjectPool<SPIRVariable>);
	pool_group->pools[TypeConstant].reset(new ObjectPool<SPIRConstant>);
	pool_group->pools[TypeFunction].reset(new ObjectPool<SPIRFunction>);
	pool_group->pools[TypeFunctionPrototype].reset(new ObjectPool<SPIRFunctionPrototype>);
	pool_group->pools[TypeBlock].reset(new ObjectPool<SPIRBlock>);
	pool_group->pools[TypeExtension].reset(new ObjectPool<SPIRExtension>);
	pool_group->pools[TypeExpression].reset(new ObjectPool<SPIRExpression>);
	pool_group->pools[TypeConstantOp].reset(new ObjectPool<SPIRConstantOp>);
	pool_group->pools[TypeCombinedImageSampler].reset(new ObjectPool<SPIRCombinedImageSampler>);
	pool_group->pools[TypeAccessChain].reset(new ObjectPool<SPIRAccessChain>);
	pool_group->pools[TypeUndef].reset(new ObjectPool<SPIRUndef>);
	pool_group->pools[TypeString].reset(new ObjectPool<SPIRString>);
}